

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qcolordialog.cpp
# Opt level: O1

void __thiscall QtPrivate::QColorLuminancePicker::setVal(QColorLuminancePicker *this,int v)

{
  int iVar1;
  int iVar2;
  long in_FS_OFFSET;
  int local_44;
  int local_40;
  int local_3c;
  void *local_38;
  int *piStack_30;
  int *local_28;
  int *piStack_20;
  long local_18;
  
  local_18 = *(long *)(in_FS_OFFSET + 0x28);
  if (this->val != v) {
    iVar1 = 0xff;
    if (v < 0xff) {
      iVar1 = v;
    }
    iVar2 = 0;
    if (0 < iVar1) {
      iVar2 = iVar1;
    }
    this->val = iVar2;
    if (this->pix != (QPixmap *)0x0) {
      (**(code **)(*(long *)this->pix + 8))();
    }
    this->pix = (QPixmap *)0x0;
    QWidget::repaint(&this->super_QWidget);
    local_44 = this->val;
    local_3c = this->hue;
    local_40 = this->sat;
    piStack_30 = &local_3c;
    local_28 = &local_40;
    piStack_20 = &local_44;
    local_38 = (void *)0x0;
    QMetaObject::activate((QObject *)this,&staticMetaObject,0,&local_38);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_18) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QColorLuminancePicker::setVal(int v)
{
    if (val == v)
        return;
    val = qMax(0, qMin(v,255));
    delete pix; pix=nullptr;
    repaint();
    emit newHsv(hue, sat, val);
}